

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void ypr_encode(ly_out *out,char *text,ssize_t len)

{
  byte bVar1;
  char *buf;
  char *buf_00;
  size_t sVar2;
  size_t len_00;
  
  if (len == 0) {
    return;
  }
  if (len < 0) {
    len = strlen(text);
  }
  sVar2 = 0;
  len_00 = 0;
  buf = text;
  do {
    if (len == sVar2) {
      ly_write_(out,buf,len_00);
      return;
    }
    bVar1 = text[sVar2];
    if (((bVar1 - 9 < 2) || (bVar1 == 0x22)) || (bVar1 == 0x5c)) {
      ly_write_(out,buf,len_00);
      if (bVar1 == 0x5c) {
        buf_00 = "\\\\";
LAB_001879bd:
        ly_write_(out,buf_00,2);
      }
      else {
        buf_00 = "\\n";
        if (bVar1 == 10) goto LAB_001879bd;
        if (bVar1 == 0x22) {
          buf_00 = "\\\"";
          goto LAB_001879bd;
        }
        if (bVar1 == 9) {
          buf_00 = "\\t";
          goto LAB_001879bd;
        }
      }
      buf = buf + len_00 + 1;
      len_00 = 0;
    }
    else {
      len_00 = len_00 + 1;
    }
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

static void
ypr_encode(struct ly_out *out, const char *text, ssize_t len)
{
    size_t i, start_len;
    const char *start;
    char special = 0;

    if (!len) {
        return;
    }

    if (len < 0) {
        len = strlen(text);
    }

    start = text;
    start_len = 0;
    for (i = 0; i < (size_t)len; ++i) {
        switch (text[i]) {
        case '\n':
        case '\t':
        case '\"':
        case '\\':
            special = text[i];
            break;
        default:
            ++start_len;
            break;
        }

        if (special) {
            ly_write_(out, start, start_len);
            switch (special) {
            case '\n':
                ly_write_(out, "\\n", 2);
                break;
            case '\t':
                ly_write_(out, "\\t", 2);
                break;
            case '\"':
                ly_write_(out, "\\\"", 2);
                break;
            case '\\':
                ly_write_(out, "\\\\", 2);
                break;
            }

            start += start_len + 1;
            start_len = 0;

            special = 0;
        }
    }

    ly_write_(out, start, start_len);
}